

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall
QWidgetRepaintManager::moveStaticWidgets(QWidgetRepaintManager *this,QWidget *reparented)

{
  QWidget *child;
  bool bVar1;
  QWidgetRepaintManager *this_00;
  uint uVar2;
  ulong i;
  
  this_00 = QWidgetPrivate::maybeRepaintManager(*(QWidgetPrivate **)&reparented->field_0x8);
  if (this_00 == (QWidgetRepaintManager *)this) {
    return;
  }
  uVar2 = 0;
  do {
    i = (ulong)uVar2;
    while( true ) {
      if (*(ulong *)(this + 0x78) <= i) {
        return;
      }
      child = *(QWidget **)(*(long *)(this + 0x70) + i * 8);
      if ((child != reparented) && (bVar1 = QWidget::isAncestorOf(reparented,child), !bVar1)) break;
      QList<QWidget_*>::removeAt((QList<QWidget_*> *)(this + 0x68),i);
      if (this_00 != (QWidgetRepaintManager *)0x0) {
        addStaticWidget((QWidgetRepaintManager *)this_00,child);
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void QWidgetRepaintManager::moveStaticWidgets(QWidget *reparented)
{
    Q_ASSERT(reparented);
    QWidgetRepaintManager *newPaintManager = reparented->d_func()->maybeRepaintManager();
    if (newPaintManager == this)
        return;

    int i = 0;
    while (i < staticWidgets.size()) {
        QWidget *w = staticWidgets.at(i);
        if (reparented == w || reparented->isAncestorOf(w)) {
            staticWidgets.removeAt(i);
            if (newPaintManager)
                newPaintManager->addStaticWidget(w);
        } else {
            ++i;
        }
    }
}